

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O0

int create_gear(gears_t_conflict1 *gears,int id,float inner,float outer,float width,int teeth,
               float tooth_depth)

{
  GLenum GVar1;
  gear_conflict *pgVar2;
  Vertex *pafVar3;
  Strip *pSVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int local_a8;
  GLenum err;
  int k;
  float t [2];
  float n [3];
  int j;
  int i;
  float c [5];
  float local_68 [2];
  float s [5];
  float ai;
  float a1;
  float da;
  float r2;
  float r1;
  float r0;
  gear_conflict *gear;
  float tooth_depth_local;
  int teeth_local;
  float width_local;
  float outer_local;
  float inner_local;
  int id_local;
  gears_t_conflict1 *gears_local;
  
  local_a8 = 0;
  pgVar2 = (gear_conflict *)calloc(1,0x28);
  if (pgVar2 == (gear_conflict *)0x0) {
    printf("calloc gear failed\n");
  }
  else {
    gears->gear[id] = pgVar2;
    pgVar2->nvertices = 0;
    pafVar3 = (Vertex *)calloc((long)(teeth * 0x22),0x20);
    pgVar2->vertices = pafVar3;
    if (pgVar2->vertices == (Vertex *)0x0) {
      printf("calloc vertices failed\n");
    }
    else {
      pgVar2->nstrips = teeth * 7;
      pSVar4 = (Strip *)calloc((long)pgVar2->nstrips,8);
      pgVar2->strips = pSVar4;
      if (pgVar2->strips == (Strip *)0x0) {
        printf("calloc strips failed\n");
      }
      else {
        fVar5 = outer - tooth_depth / 2.0;
        fVar6 = outer + tooth_depth / 2.0;
        for (n[2] = 0.0; (int)n[2] < teeth; n[2] = (float)((int)n[2] + 1)) {
          s[4] = (float)(int)n[2] * (6.2831855 / (float)teeth);
          for (n[1] = 0.0; (int)n[1] < 5; n[1] = (float)((int)n[1] + 1)) {
            sincosf((float)(int)n[1] * ((6.2831855 / (float)teeth) / 4.0) + s[4],
                    local_68 + (int)n[1],(float *)(&j + (int)n[1]));
          }
          pgVar2->strips[local_a8].begin = pgVar2->nvertices;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * (float)i;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * local_68[1];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (fVar6 * 0.36 * local_68[1]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (fVar6 * 0.36 * (float)i) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * c[0];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * s[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (fVar6 * 0.36 * s[0]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (fVar6 * 0.36 * c[0]) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (fVar5 * 0.36 * local_68[0]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (fVar5 * 0.36 * (float)j) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[1];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[1];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (fVar5 * 0.36 * s[1]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (fVar5 * 0.36 * c[1]) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = inner * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (inner * 0.36 * local_68[0]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (inner * 0.36 * (float)j) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (fVar5 * 0.36 * s[2]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (fVar5 * 0.36 * c[2]) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = inner * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = 1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = (inner * 0.36 * s[2]) / fVar5 + 0.5;
          pgVar2->vertices[pgVar2->nvertices][7] = (inner * 0.36 * c[2]) / fVar5 + 0.5;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8].count = 7;
          pgVar2->strips[local_a8 + 1].begin = pgVar2->nvertices;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * (float)i;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * local_68[1];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * c[0];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * s[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[1];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[1];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = inner * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = inner * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][4] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][5] = -1.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8 + 1].count = 7;
          pgVar2->strips[local_a8 + 2].begin = pgVar2->nvertices;
          fVar7 = fVar6 * local_68[1] + -(fVar5 * local_68[0]);
          fVar8 = fVar5 * (float)j + -(fVar6 * (float)i);
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * (float)i;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * local_68[1];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * (float)i;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * local_68[1];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8 + 2].count = 4;
          pgVar2->strips[local_a8 + 3].begin = pgVar2->nvertices;
          fVar7 = s[0] - local_68[1];
          fVar8 = (float)i - c[0];
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * (float)i;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * local_68[1];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * (float)i;
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * local_68[1];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * c[0];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * s[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * c[0];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * s[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8 + 3].count = 4;
          pgVar2->strips[local_a8 + 4].begin = pgVar2->nvertices;
          fVar7 = fVar5 * s[1] + -(fVar6 * s[0]);
          fVar8 = fVar6 * c[0] + -(fVar5 * c[1]);
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * c[0];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * s[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar6 * c[0];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar6 * s[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[1];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[1];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[1];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[1];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8 + 4].count = 4;
          pgVar2->strips[local_a8 + 5].begin = pgVar2->nvertices;
          fVar7 = s[2] - s[1];
          fVar8 = c[1] - c[2];
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[1];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[1];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[1];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[1];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = fVar5 * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = fVar5 * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8 + 5].count = 4;
          pgVar2->strips[local_a8 + 6].begin = pgVar2->nvertices;
          fVar7 = local_68[0] - s[2];
          fVar8 = c[2] - (float)j;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = inner * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * (float)j;
          pgVar2->vertices[pgVar2->nvertices][1] = inner * local_68[0];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = inner * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->vertices[pgVar2->nvertices][0] = inner * c[2];
          pgVar2->vertices[pgVar2->nvertices][1] = inner * s[2];
          pgVar2->vertices[pgVar2->nvertices][2] = -width / 2.0;
          pgVar2->vertices[pgVar2->nvertices][3] = fVar7;
          pgVar2->vertices[pgVar2->nvertices][4] = fVar8;
          pgVar2->vertices[pgVar2->nvertices][5] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][6] = 0.0;
          pgVar2->vertices[pgVar2->nvertices][7] = 0.0;
          pgVar2->nvertices = pgVar2->nvertices + 1;
          pgVar2->strips[local_a8 + 6].count = 4;
          local_a8 = local_a8 + 7;
        }
        (*gears->glGenBuffers)(1,&pgVar2->vbo);
        if (pgVar2->vbo == 0) {
          printf("glGenBuffers failed\n");
        }
        else {
          (*gears->glBindBuffer)(0x8892,pgVar2->vbo);
          GVar1 = (*gears->glGetError)();
          if (GVar1 == 0) {
            (*gears->glBufferData)(0x8892,(long)pgVar2->nvertices << 5,pgVar2->vertices,0x88e4);
            GVar1 = (*gears->glGetError)();
            if (GVar1 == 0) {
              return 0;
            }
            printf("glBufferData failed: 0x%x\n",(ulong)GVar1);
          }
          else {
            printf("glBindBuffer failed: 0x%x\n",(ulong)GVar1);
          }
        }
      }
    }
    delete_gear(gears,id);
  }
  return -1;
}

Assistant:

static int create_gear(gears_t *gears, int id, float inner, float outer, float width, int teeth, float tooth_depth)
{
  struct gear *gear;
  float r0, r1, r2, da, a1, ai, s[5], c[5];
  int i, j;
  float n[3], t[2];
  int k = 0;
  GLenum err = GL_NO_ERROR;

  gear = calloc(1, sizeof(struct gear));
  if (!gear) {
    printf("calloc gear failed\n");
    return -1;
  }

  gears->gear[id] = gear;

  gear->nvertices = 0;
  gear->vertices = calloc(34 * teeth, sizeof(Vertex));
  if (!gear->vertices) {
    printf("calloc vertices failed\n");
    goto out;
  }

  gear->nstrips = 7 * teeth;
  gear->strips = calloc(gear->nstrips, sizeof(Strip));
  if (!gear->strips) {
    printf("calloc strips failed\n");
    goto out;
  }

  r0 = inner;
  r1 = outer - tooth_depth / 2;
  r2 = outer + tooth_depth / 2;
  a1 = 2 * M_PI / teeth;
  da = a1 / 4;

  #define normal(nx, ny, nz) \
    n[0] = nx; \
    n[1] = ny; \
    n[2] = nz;

  #define texcoord(tx, ty) \
    t[0] = tx; \
    t[1] = ty;

  #define vertex(x, y, z) \
    gear->vertices[gear->nvertices][0] = x; \
    gear->vertices[gear->nvertices][1] = y; \
    gear->vertices[gear->nvertices][2] = z; \
    gear->vertices[gear->nvertices][3] = n[0]; \
    gear->vertices[gear->nvertices][4] = n[1]; \
    gear->vertices[gear->nvertices][5] = n[2]; \
    gear->vertices[gear->nvertices][6] = t[0]; \
    gear->vertices[gear->nvertices][7] = t[1]; \
    gear->nvertices++;

  for (i = 0; i < teeth; i++) {
    ai = i * a1;
    for (j = 0; j < 5; j++) {
      sincosf(ai + j * da, &s[j], &c[j]);
    }

    /* front face begin */
    gear->strips[k].begin = gear->nvertices;
    /* front face normal */
    normal(0, 0, 1);
    /* front face vertices */
    texcoord(0.36 * r2 * s[1] / r1 + 0.5, 0.36 * r2 * c[1] / r1 + 0.5);
    vertex(r2 * c[1], r2 * s[1], width / 2);
    texcoord(0.36 * r2 * s[2] / r1 + 0.5, 0.36 * r2 * c[2] / r1 + 0.5);
    vertex(r2 * c[2], r2 * s[2], width / 2);
    texcoord(0.36 * r1 * s[0] / r1 + 0.5, 0.36 * r1 * c[0] / r1 + 0.5);
    vertex(r1 * c[0], r1 * s[0], width / 2);
    texcoord(0.36 * r1 * s[3] / r1 + 0.5, 0.36 * r1 * c[3] / r1 + 0.5);
    vertex(r1 * c[3], r1 * s[3], width / 2);
    texcoord(0.36 * r0 * s[0] / r1 + 0.5, 0.36 * r0 * c[0] / r1 + 0.5);
    vertex(r0 * c[0], r0 * s[0], width / 2);
    texcoord(0.36 * r1 * s[4] / r1 + 0.5, 0.36 * r1 * c[4] / r1 + 0.5);
    vertex(r1 * c[4], r1 * s[4], width / 2);
    texcoord(0.36 * r0 * s[4] / r1 + 0.5, 0.36 * r0 * c[4] / r1 + 0.5);
    vertex(r0 * c[4], r0 * s[4], width / 2);
    texcoord(0, 0);
    /* front face end */
    gear->strips[k].count = 7;
    k++;

    /* back face begin */
    gear->strips[k].begin = gear->nvertices;
    /* back face normal */
    normal(0, 0, -1);
    /* back face vertices */
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    vertex(r1 * c[0], r1 * s[0], -width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    vertex(r0 * c[0], r0 * s[0], -width / 2);
    vertex(r1 * c[4], r1 * s[4], -width / 2);
    vertex(r0 * c[4], r0 * s[4], -width / 2);
    /* back face end */
    gear->strips[k].count = 7;
    k++;

    /* first outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* first outward face normal */
    normal(r2 * s[1] - r1 * s[0], r1 * c[0] - r2 * c[1], 0);
    /* first outward face vertices */
    vertex(r1 * c[0], r1 * s[0],  width / 2);
    vertex(r1 * c[0], r1 * s[0], -width / 2);
    vertex(r2 * c[1], r2 * s[1],  width / 2);
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    /* first outward face end */
    gear->strips[k].count = 4;
    k++;

    /* second outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* second outward face normal */
    normal(s[2] - s[1], c[1] - c[2], 0);
    /* second outward face vertices */
    vertex(r2 * c[1], r2 * s[1],  width / 2);
    vertex(r2 * c[1], r2 * s[1], -width / 2);
    vertex(r2 * c[2], r2 * s[2],  width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    /* second outward face end */
    gear->strips[k].count = 4;
    k++;

    /* third outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* third outward face normal */
    normal(r1 * s[3] - r2 * s[2], r2 * c[2] - r1 * c[3], 0);
    /* third outward face vertices */
    vertex(r2 * c[2], r2 * s[2],  width / 2);
    vertex(r2 * c[2], r2 * s[2], -width / 2);
    vertex(r1 * c[3], r1 * s[3],  width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    /* third outward face end */
    gear->strips[k].count = 4;
    k++;

    /* fourth outward face begin */
    gear->strips[k].begin = gear->nvertices;
    /* fourth outward face normal */
    normal(s[4] - s[3], c[3] - c[4], 0);
    /* fourth outward face vertices */
    vertex(r1 * c[3], r1 * s[3],  width / 2);
    vertex(r1 * c[3], r1 * s[3], -width / 2);
    vertex(r1 * c[4], r1 * s[4],  width / 2);
    vertex(r1 * c[4], r1 * s[4], -width / 2);
    /* fourth outward face end */
    gear->strips[k].count = 4;
    k++;

    /* inside face begin */
    gear->strips[k].begin = gear->nvertices;
    /* inside face normal */
    normal(s[0] - s[4], c[4] - c[0], 0);
    /* inside face vertices */
    vertex(r0 * c[0], r0 * s[0],  width / 2);
    vertex(r0 * c[0], r0 * s[0], -width / 2);
    vertex(r0 * c[4], r0 * s[4],  width / 2);
    vertex(r0 * c[4], r0 * s[4], -width / 2);
    /* inside face end */
    gear->strips[k].count = 4;
    k++;
  }

  /* vertex buffer object */

  gears->glGenBuffers(1, &gear->vbo);
  if (!gear->vbo) {
    printf("glGenBuffers failed\n");
    goto out;
  }

  gears->glBindBuffer(GL_ARRAY_BUFFER, gear->vbo);
  err = gears->glGetError();
  if (err) {
    printf("glBindBuffer failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  gears->glBufferData(GL_ARRAY_BUFFER, gear->nvertices * sizeof(Vertex), gear->vertices, GL_STATIC_DRAW);
  err = gears->glGetError();
  if (err) {
    printf("glBufferData failed: 0x%x\n", (unsigned int)err);
    goto out;
  }

  return 0;

out:
  delete_gear(gears, id);
  return -1;
}